

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::put_mutable_item
          (dht_default_storage *this,sha1_hash *target,span<const_char> buf,signature *sig,
          sequence_number seq,public_key *pk,span<const_char> salt,address *addr)

{
  anon_unknown_0 *this_00;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  const_iterator __position;
  char *__beg;
  char *__end;
  pointer ppVar4;
  difference_type dVar5;
  ulong uVar6;
  __enable_if_t<is_constructible<value_type,_pair<digest32<160L>,_dht_mutable_item>_>::value,_pair<iterator,_bool>_>
  _Var7;
  span<const_char> buf_00;
  span<const_char> buf_01;
  dht_immutable_item *local_358;
  char *local_350;
  int64_t local_348;
  anon_unknown_0 *local_340;
  dht_mutable_item *item;
  _Base_ptr local_328;
  undefined1 local_320;
  pair<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>
  local_318;
  pair<std::_Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>,_bool>
  local_1e0;
  allocator<char> local_1c9;
  string local_1c8 [32];
  int64_t local_1a8;
  dht_immutable_item *local_190;
  char *local_188;
  undefined1 local_180 [8];
  dht_mutable_item to_add;
  const_iterator j;
  _Self local_40;
  iterator i;
  signature *sig_local;
  sha1_hash *target_local;
  dht_default_storage *this_local;
  sequence_number seq_local;
  span<const_char> buf_local;
  
  dVar5 = buf.m_len;
  seq_local.value = (int64_t)buf.m_ptr;
  i._M_node = (_Base_ptr)sig;
  local_40._M_node =
       (_Base_ptr)
       ::std::
       map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
       ::find(&this->m_mutable_table,target);
  j._M_node = (_Base_ptr)
              ::std::
              map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
              ::end(&this->m_mutable_table);
  bVar1 = ::std::operator==(&local_40,(_Self *)&j);
  if (bVar1) {
    sVar3 = ::std::
            map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
            ::size(&this->m_mutable_table);
    uVar2 = (*this->m_settings->_vptr_settings_interface[5])(this->m_settings,0x408d);
    if ((int)uVar2 <= (int)sVar3) {
      __position = pick_least_important_item<libtorrent::dht::(anonymous_namespace)::dht_mutable_item>
                             (&this->m_node_ids,&this->m_mutable_table);
      to_add.salt.field_2._8_8_ =
           ::std::
           map<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>_>
           ::erase(&this->m_mutable_table,__position);
      uVar2 = (this->m_counters).mutable_data - 1;
      (this->m_counters).mutable_data = uVar2;
    }
    uVar6 = (ulong)uVar2;
    dht_mutable_item::dht_mutable_item((dht_mutable_item *)local_180);
    span<char_const>::span<libtorrent::span<char_const>,char_const,void>
              ((span<char_const> *)&local_190,(span<const_char> *)&seq_local);
    buf_00.m_len = uVar6;
    buf_00.m_ptr = local_188;
    set_value((anon_unknown_0 *)local_180,local_190,buf_00);
    local_1a8 = seq.value;
    sequence_number::operator=((sequence_number *)(to_add.sig.bytes._M_elems + 0x38),seq);
    __beg = span<const_char>::begin(&salt);
    __end = span<const_char>::end(&salt);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<char_const*,void>(local_1c8,__beg,__end,&local_1c9);
    ::std::__cxx11::string::operator=((string *)(to_add.key.bytes._M_elems + 0x18),local_1c8);
    ::std::__cxx11::string::~string(local_1c8);
    ::std::allocator<char>::~allocator(&local_1c9);
    to_add.super_dht_immutable_item.num_announcers = (i._M_node)->_M_color;
    to_add.super_dht_immutable_item.size = *(int *)&(i._M_node)->field_0x4;
    to_add.sig.bytes._M_elems._0_8_ = (i._M_node)->_M_parent;
    to_add.sig.bytes._M_elems._8_8_ = (i._M_node)->_M_left;
    to_add.sig.bytes._M_elems._16_8_ = (i._M_node)->_M_right;
    to_add.sig.bytes._M_elems._24_8_ = *(undefined8 *)(i._M_node + 1);
    to_add.sig.bytes._M_elems._32_8_ = i._M_node[1]._M_parent;
    to_add.sig.bytes._M_elems._40_8_ = i._M_node[1]._M_left;
    to_add.sig.bytes._M_elems._48_8_ = i._M_node[1]._M_right;
    to_add.seq.value = *(int64_t *)(pk->bytes)._M_elems;
    to_add.key.bytes._M_elems._0_8_ = *(undefined8 *)((pk->bytes)._M_elems + 8);
    to_add.key.bytes._M_elems._8_8_ = *(undefined8 *)((pk->bytes)._M_elems + 0x10);
    to_add.key.bytes._M_elems._16_8_ = *(undefined8 *)((pk->bytes)._M_elems + 0x18);
    ::std::
    make_pair<libtorrent::digest32<160l>const&,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>
              (&local_318,target,(dht_mutable_item *)local_180);
    _Var7 = ::std::
            map<libtorrent::digest32<160l>,libtorrent::dht::(anonymous_namespace)::dht_mutable_item,std::less<libtorrent::digest32<160l>>,std::allocator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>>>
            ::
            insert<std::pair<libtorrent::digest32<160l>,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>>
                      ((map<libtorrent::digest32<160l>,libtorrent::dht::(anonymous_namespace)::dht_mutable_item,std::less<libtorrent::digest32<160l>>,std::allocator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>>>
                        *)&this->m_mutable_table,&local_318);
    local_328 = (_Base_ptr)_Var7.first._M_node;
    local_320 = _Var7.second;
    local_1e0.first._M_node = local_328;
    local_1e0.second = (bool)local_320;
    ::std::
    tie<std::_Rb_tree_iterator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>>,std::_Swallow_assign_const>
              ((_Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>
                *)&item,(_Swallow_assign *)&local_40);
    ::std::
    tuple<std::_Rb_tree_iterator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>>&,std::_Swallow_assign_const&>
    ::operator=((tuple<std::_Rb_tree_iterator<std::pair<libtorrent::digest32<160l>const,libtorrent::dht::(anonymous_namespace)::dht_mutable_item>>&,std::_Swallow_assign_const&>
                 *)&item,&local_1e0);
    ::std::
    pair<libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>::
    ~pair(&local_318);
    (this->m_counters).mutable_data = (this->m_counters).mutable_data + 1;
    dht_mutable_item::~dht_mutable_item((dht_mutable_item *)local_180);
  }
  else {
    ppVar4 = ::std::
             _Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>
             ::operator->(&local_40);
    local_340 = (anon_unknown_0 *)&ppVar4->second;
    local_348 = seq.value;
    bVar1 = sequence_number::operator<(&(ppVar4->second).seq,seq);
    this_00 = local_340;
    if (bVar1) {
      span<char_const>::span<libtorrent::span<char_const>,char_const,void>
                ((span<char_const> *)&local_358,(span<const_char> *)&seq_local);
      buf_01.m_len = dVar5;
      buf_01.m_ptr = local_350;
      set_value(this_00,local_358,buf_01);
      sequence_number::operator=((sequence_number *)(local_340 + 0xd8),seq);
      memcpy(local_340 + 0x98,i._M_node,0x40);
    }
  }
  ppVar4 = ::std::
           _Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_libtorrent::dht::(anonymous_namespace)::dht_mutable_item>_>
           ::operator->(&local_40);
  touch_item(&(ppVar4->second).super_dht_immutable_item,addr);
  return;
}

Assistant:

void put_mutable_item(sha1_hash const& target
			, span<char const> buf
			, signature const& sig
			, sequence_number const seq
			, public_key const& pk
			, span<char const> salt
			, address const& addr) override
		{
			TORRENT_ASSERT(!m_node_ids.empty());
			auto i = m_mutable_table.find(target);
			if (i == m_mutable_table.end())
			{
				// this is the case where we don't have an item in this slot
				// make sure we don't add too many items
				if (int(m_mutable_table.size()) >= m_settings.get_int(settings_pack::dht_max_dht_items))
				{
					auto const j = pick_least_important_item(m_node_ids
						, m_mutable_table);

					TORRENT_ASSERT(j != m_mutable_table.end());
					m_mutable_table.erase(j);
					m_counters.mutable_data -= 1;
				}
				dht_mutable_item to_add;
				set_value(to_add, buf);
				to_add.seq = seq;
				to_add.salt = {salt.begin(), salt.end()};
				to_add.sig = sig;
				to_add.key = pk;

				std::tie(i, std::ignore) = m_mutable_table.insert(
					std::make_pair(target, std::move(to_add)));
				m_counters.mutable_data += 1;
			}
			else
			{
				// this is the case where we already have an item in this slot
				dht_mutable_item& item = i->second;

				if (item.seq < seq)
				{
					set_value(item, buf);
					item.seq = seq;
					item.sig = sig;
				}
			}

			touch_item(i->second, addr);
		}